

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex.c
# Opt level: O3

void prf_vertex_clear(prf_vertex_t *vertex)

{
  if (vertex != (prf_vertex_t *)0x0) {
    vertex->packed_color = 0;
    vertex->color_index = 0;
    vertex->has_normal = 0;
    vertex->has_texture = 0;
    vertex->normal[1] = 0.0;
    vertex->normal[2] = 0.0;
    vertex->texture[0] = 0.0;
    vertex->texture[1] = 0.0;
    vertex->z = 0.0;
    vertex->color_name_index = 0;
    vertex->flags = 0;
    vertex->normal[0] = 0.0;
    vertex->x = 0.0;
    vertex->y = 0.0;
  }
  return;
}

Assistant:

void
prf_vertex_clear(
    prf_vertex_t * vertex )
{
    if ( vertex != NULL ) {
        prf_dblwrite( vertex->x, 0.0f );
        prf_dblwrite( vertex->y, 0.0f );
        prf_dblwrite( vertex->z, 0.0f );
        vertex->color_name_index = 0;
        vertex->flags = 0;
        vertex->normal[0] = 0.0f;
        vertex->normal[1] = 0.0f;
        vertex->normal[2] = 0.0f;
        vertex->texture[0] = 0.0f;
        vertex->texture[1] = 0.0f;
        vertex->packed_color = 0;
        vertex->color_index = 0;
        vertex->has_normal = FALSE;
        vertex->has_texture = FALSE;
    }
}